

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O2

void __thiscall OSTEIDeriv1_Writer::WriteAccumulation(OSTEIDeriv1_Writer *this)

{
  int iVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar2;
  _Base_ptr p_Var3;
  QAM *pQVar4;
  QAMSet topq;
  undefined1 local_160 [48];
  string local_130;
  string local_110;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_f0;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_f0,this_00);
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"////////////////////////////////////\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"// Accumulate contracted integrals\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"////////////////////////////////////\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"if(lastoffset == 0)\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  for (p_Var3 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_f0._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pQVar4 = (QAM *)(p_Var3 + 1);
    QAM::QAM((QAM *)local_90,pQVar4);
    iVar1 = NCART((QAM *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 0x10));
    poVar2 = (this->super_OSTEI_Writer_Base).os_;
    if (p_Var3[1]._M_right == (_Base_ptr)0x0) {
      poVar2 = std::operator<<(poVar2,(string *)&indent6_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"contract_all    (");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,", ");
      PrimVarName_abi_cxx11_((string *)local_160,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)local_160);
      poVar2 = std::operator<<(poVar2,", ");
      PrimPtrName_abi_cxx11_(&local_110,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_110);
      std::operator<<(poVar2,");\n");
      std::__cxx11::string::~string((string *)&local_110);
      pQVar4 = (QAM *)local_160;
    }
    else {
      poVar2 = std::operator<<(poVar2,(string *)&indent6_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"contract_all_fac(");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,", cfac_");
      poVar2 = std::operator<<(poVar2,(string *)&p_Var3[1]._M_left);
      poVar2 = std::operator<<(poVar2,", ");
      QAM::notag((QAM *)local_160,pQVar4);
      PrimVarName_abi_cxx11_(&local_110,(QAM *)local_160);
      poVar2 = std::operator<<(poVar2,(string *)&local_110);
      poVar2 = std::operator<<(poVar2,", ");
      PrimPtrName_abi_cxx11_(&local_130,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_130);
      std::operator<<(poVar2,");\n");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      pQVar4 = (QAM *)(local_160 + 0x10);
    }
    std::__cxx11::string::~string((string *)pQVar4);
  }
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  for (p_Var3 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_f0._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pQVar4 = (QAM *)(p_Var3 + 1);
    QAM::QAM((QAM *)local_c0,pQVar4);
    iVar1 = NCART((QAM *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 0x10));
    poVar2 = (this->super_OSTEI_Writer_Base).os_;
    if (p_Var3[1]._M_right == (_Base_ptr)0x0) {
      poVar2 = std::operator<<(poVar2,(string *)&indent6_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"contract    (");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,", shelloffsets, ");
      PrimVarName_abi_cxx11_((string *)local_160,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)local_160);
      poVar2 = std::operator<<(poVar2,", ");
      PrimPtrName_abi_cxx11_(&local_110,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_110);
      std::operator<<(poVar2,");\n");
      std::__cxx11::string::~string((string *)&local_110);
      pQVar4 = (QAM *)local_160;
    }
    else {
      poVar2 = std::operator<<(poVar2,(string *)&indent6_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"contract_fac(");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,", cfac_");
      poVar2 = std::operator<<(poVar2,(string *)&p_Var3[1]._M_left);
      poVar2 = std::operator<<(poVar2,", shelloffsets, ");
      QAM::notag((QAM *)local_160,pQVar4);
      PrimVarName_abi_cxx11_(&local_110,(QAM *)local_160);
      poVar2 = std::operator<<(poVar2,(string *)&local_110);
      poVar2 = std::operator<<(poVar2,", ");
      PrimPtrName_abi_cxx11_(&local_130,pQVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_130);
      std::operator<<(poVar2,");\n");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      pQVar4 = (QAM *)(local_160 + 0x10);
    }
    std::__cxx11::string::~string((string *)pQVar4);
  }
  for (p_Var3 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_f0._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
    PrimPtrName_abi_cxx11_((string *)local_160,(QAM *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,(string *)local_160);
    poVar2 = std::operator<<(poVar2," += lastoffset*");
    QAM::QAM((QAM *)local_60,(QAM *)(p_Var3 + 1));
    iVar1 = NCART((QAM *)local_60);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::operator<<(poVar2,";\n");
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    std::__cxx11::string::~string((string *)local_160);
  }
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_f0);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_all_fac(" << ncart << ", cfac_" << it.tag << ", "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract_all    (" << ncart << ", " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_fac(" << ncart << ", cfac_" << it.tag << ", shelloffsets, "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract    (" << ncart << ", shelloffsets, " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}